

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O2

bool Assimp::PLY::PropertyInstance::ParseValue(char **pCur,EDataType eType,ValueUnion *out)

{
  uint uVar1;
  char *pcVar2;
  ai_real f;
  double d;
  
  pcVar2 = *pCur;
  if (pcVar2 == (char *)0x0) {
    __assert_fail("__null != pCur",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyParser.cpp"
                  ,0x3ab,
                  "static bool Assimp::PLY::PropertyInstance::ParseValue(const char *&, PLY::EDataType, PLY::PropertyInstance::ValueUnion *)"
                 );
  }
  if (out != (ValueUnion *)0x0) {
    switch(eType) {
    case EDT_Char:
    case EDT_Short:
    case EDT_Int:
      uVar1 = strtol10(pcVar2,pCur);
      break;
    case EDT_UChar:
    case EDT_UShort:
    case EDT_UInt:
      uVar1 = strtoul10(pcVar2,pCur);
      break;
    case EDT_Float:
      pcVar2 = fast_atoreal_move<float>(pcVar2,&f,true);
      *pCur = pcVar2;
      out->fFloat = f;
      return true;
    case EDT_Double:
      pcVar2 = fast_atoreal_move<double>(pcVar2,&d,true);
      *pCur = pcVar2;
      out->fDouble = d;
      return true;
    default:
      return false;
    }
    out->iUInt = uVar1;
    return true;
  }
  __assert_fail("__null != out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyParser.cpp"
                ,0x3ac,
                "static bool Assimp::PLY::PropertyInstance::ParseValue(const char *&, PLY::EDataType, PLY::PropertyInstance::ValueUnion *)"
               );
}

Assistant:

bool PLY::PropertyInstance::ParseValue(const char* &pCur,
  PLY::EDataType eType,
  PLY::PropertyInstance::ValueUnion* out)
{
  ai_assert(NULL != pCur);
  ai_assert(NULL != out);

  //calc element size
  bool ret = true;
  switch (eType)
  {
  case EDT_UInt:
  case EDT_UShort:
  case EDT_UChar:

    out->iUInt = (uint32_t)strtoul10(pCur, &pCur);
    break;

  case EDT_Int:
  case EDT_Short:
  case EDT_Char:

    out->iInt = (int32_t)strtol10(pCur, &pCur);
    break;

  case EDT_Float:
    // technically this should cast to float, but people tend to use float descriptors for double data
    // this is the best way to not risk losing precision on import and it doesn't hurt to do this
    ai_real f;
    pCur = fast_atoreal_move<ai_real>(pCur, f);
    out->fFloat = (ai_real)f;
    break;

  case EDT_Double:
    double d;
    pCur = fast_atoreal_move<double>(pCur, d);
    out->fDouble = (double)d;
    break;

  case EDT_INVALID:
  default:
    ret = false;
    break;
  }

  return ret;
}